

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TgExpendSymmetry(Abc_TgMan_t *pMan,char *pDest)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  
  iVar2 = 0;
  for (lVar3 = 0; lVar3 < pMan->nGVars; lVar3 = lVar3 + 1) {
    pcVar6 = pMan->pPerm + lVar3;
    pcVar4 = pDest + iVar2;
    while( true ) {
      cVar1 = *pcVar6;
      if ((long)cVar1 < 0) break;
      *pcVar4 = cVar1;
      pcVar6 = pMan->symLink + cVar1;
      iVar2 = iVar2 + 1;
      pcVar4 = pcVar4 + 1;
    }
  }
  lVar3 = (long)pMan->nVars;
  lVar5 = 0;
  while( true ) {
    pcVar6 = pMan->symLink + lVar3;
    lVar3 = (long)*pcVar6;
    if (lVar3 < 0) break;
    pDest[lVar5 + iVar2] = *pcVar6;
    lVar5 = lVar5 + 1;
  }
  if ((int)lVar5 + (iVar2 - pMan->nVars) == 0) {
    return iVar2;
  }
  __assert_fail("i == pMan->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                ,0x7c1,"int Abc_TgExpendSymmetry(Abc_TgMan_t *, char *)");
}

Assistant:

int Abc_TgExpendSymmetry(Abc_TgMan_t * pMan, char * pDest)
{
    int i = 0, j, k, s;
    char * pPerm = pMan->pPerm;
    for (j = 0; j < pMan->nGVars; j++)
        for (k = pPerm[j]; k >= 0; k = pMan->symLink[k])
            pDest[i++] = k;
    s = i;
    for (k = pMan->symLink[pMan->nVars]; k >= 0; k = pMan->symLink[k])
        pDest[i++] = k;
    assert(i == pMan->nVars);
    return s;
}